

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_image_function.cpp
# Opt level: O0

void example1(Image *imageIn1,Image *imageIn2,Image *imageOut)

{
  uint32_t in_ESI;
  uint32_t in_EDI;
  Image croppedOut;
  Image croppedIn2;
  Image croppedIn1;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 uVar2;
  undefined2 in_stack_ffffffffffffff54;
  uint8_t in_stack_ffffffffffffff56;
  uint8_t in_stack_ffffffffffffff57;
  uint32_t height_;
  uint32_t width_;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff60;
  uint32_t in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  Image *in_stack_ffffffffffffffd0;
  uint32_t in_stack_ffffffffffffffd8;
  uint32_t in_stack_ffffffffffffffdc;
  Image *in_stack_ffffffffffffffe0;
  
  height_ = 0x80;
  width_ = 1;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_ffffffffffffff60,1,0x80,in_stack_ffffffffffffff57,in_stack_ffffffffffffff56);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_ffffffffffffff60,width_,height_,in_stack_ffffffffffffff57,
             in_stack_ffffffffffffff56);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_ffffffffffffff60,width_,height_,in_stack_ffffffffffffff57,
             in_stack_ffffffffffffff56);
  Image_Function::Copy
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,in_ESI,
             in_EDI);
  uVar2 = 0x80;
  uVar1 = 0x80;
  Image_Function::Copy
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,in_ESI,
             in_EDI);
  Image_Function::BitwiseOr
            ((Image *)CONCAT17(in_stack_ffffffffffffff57,
                               CONCAT16(in_stack_ffffffffffffff56,
                                        CONCAT24(in_stack_ffffffffffffff54,uVar2))),
             (Image *)CONCAT44(in_stack_ffffffffffffff4c,uVar1),(Image *)0x102811);
  Image_Function::Copy
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,in_ESI,
             in_EDI);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x10284d);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x102857);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x102861);
  return;
}

Assistant:

void example1( const PenguinV_Image::Image & imageIn1, const PenguinV_Image::Image & imageIn2, PenguinV_Image::Image & imageOut )
{
    // We allocate another images with size 128 x 128
    PenguinV_Image::Image croppedIn1( 128, 128 );
    PenguinV_Image::Image croppedIn2( 128, 128 );
    PenguinV_Image::Image croppedOut( 128, 128 );

    // Copy information from input images to cropped images

    // It is not a good style of programming but it is easy to explain all parameters!
    Image_Function::Copy( imageIn1,   // first input image
                          10,         // X coordinate where we get information from first input image
                          10,         // Y coordinate where we get information from first input image
                          croppedIn1, // first cropped image
                          0,          // X coordinate where we put information to first cropped image
                          0,          // Y coordinate where we put information to first cropped image
                          128,        // width of copying area
                          128         // height of copying area
    );

    Image_Function::Copy( imageIn2,   // second input image
                          650,        // X coordinate where we get information from second input image
                          768,        // Y coordinate where we get information from second input image
                          croppedIn1, // second cropped image
                          0,          // X coordinate where we put information to second cropped image
                          0,          // Y coordinate where we put information to second cropped image
                          128,        // width of copying area
                          128         // height of copying area
    );

    // Do Bitwise OR
    Image_Function::BitwiseOr( croppedIn1, croppedIn2, croppedOut );

    // Copy the result into output image
    Image_Function::Copy( croppedOut, // cropped output image
                          0,          // X coordinate where we get information from cropped output image
                          0,          // Y coordinate where we get information from cropped output image
                          imageOut,   // output image
                          0,          // X coordinate where we put information to output image
                          0,          // Y coordinate where we put information to output image
                          128,        // width of copying area
                          128         // height of copying area
    );
}